

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_3dVector * __thiscall
ON_SubDMeshFragment::VertexNormal
          (ON_3dVector *__return_storage_ptr__,ON_SubDMeshFragment *this,ON_2udex grid2dex)

{
  uint grid_point_index;
  
  grid_point_index =
       ON_SubDMeshFragmentGrid::PointIndexFromGrid2dex(&this->m_grid,grid2dex.i,grid2dex.j);
  VertexNormal(__return_storage_ptr__,this,grid_point_index);
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDMeshFragment::VertexNormal(
  ON_2udex grid2dex
) const
{
  return VertexNormal(m_grid.PointIndexFromGrid2dex(grid2dex.i, grid2dex.j));
}